

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FFConsoleDemo.cpp
# Opt level: O0

void __thiscall JoystickManager::changeMasterGain(JoystickManager *this,float dDeltaPercent)

{
  reference ppFVar1;
  long in_RDI;
  float in_XMM0_Da;
  
  if (-1 < *(int *)(in_RDI + 0x38)) {
    *(float *)(in_RDI + 0x40) = in_XMM0_Da / 100.0 + *(float *)(in_RDI + 0x40);
    if (*(float *)(in_RDI + 0x40) <= 1.0) {
      if (*(float *)(in_RDI + 0x40) < 0.0) {
        *(undefined4 *)(in_RDI + 0x40) = 0;
      }
    }
    else {
      *(undefined4 *)(in_RDI + 0x40) = 0x3f800000;
    }
    ppFVar1 = std::vector<OIS::ForceFeedback_*,_std::allocator<OIS::ForceFeedback_*>_>::operator[]
                        ((vector<OIS::ForceFeedback_*,_std::allocator<OIS::ForceFeedback_*>_> *)
                         (in_RDI + 0x20),(long)*(int *)(in_RDI + 0x38));
    (**(code **)(*(long *)*ppFVar1 + 0x10))(*(undefined4 *)(in_RDI + 0x40));
  }
  return;
}

Assistant:

void changeMasterGain(float dDeltaPercent)
	{
		if(_nCurrJoyInd >= 0)
		{
			_dMasterGain += dDeltaPercent / 100;
			if(_dMasterGain > 1.0)
				_dMasterGain = 1.0;
			else if(_dMasterGain < 0.0)
				_dMasterGain = 0.0;

			_vecFFDev[_nCurrJoyInd]->setMasterGain(_dMasterGain);
		}
	}